

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O2

ktx_error_code_e __thiscall ktx::CommandInfo::printInfoText(CommandInfo *this,istream *file)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ktx_error_code_e kVar4;
  char *in_RCX;
  char *pcVar5;
  ktx_error_code_e kVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view filepath;
  format_args args;
  format_args args_00;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  __string_type validationMessages;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  ostringstream messagesOS;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&messagesOS);
  filepath._M_str = in_RCX;
  filepath._M_len = (size_t)(this->options).super_OptionsSingleIn.inputFilepath._M_dataplus._M_p;
  fmtInFile_abi_cxx11_
            ((string *)&ktx2Stream,
             (ktx *)(this->options).super_OptionsSingleIn.inputFilepath._M_string_length,filepath);
  local_1b8._8_8_ = 0;
  local_1a0 = std::
              _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_info.cpp:136:106)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_info.cpp:136:106)>
              ::_M_manager;
  local_1b8._M_unused._0_8_ = (undefined8)(ostringstream *)&messagesOS;
  iVar3 = validateIOStream(file,(string *)&ktx2Stream,false,false,
                           (function<void_(const_ktx::ValidationReport_&)> *)&local_1b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
  std::__cxx11::string::~string((string *)&ktx2Stream);
  pcVar5 = "failed";
  if (iVar3 == 0) {
    pcVar5 = "successful";
  }
  fmt.size_ = 0xe;
  fmt.data_ = "Validation {}\n";
  args.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&ktx2Stream;
  args.desc_ = 0xc;
  ktx2Stream._vptr_StreambufStream = (_func_int **)pcVar5;
  ::fmt::v10::vprint(fmt,args);
  std::__cxx11::stringbuf::str();
  if (validationMessages._M_string_length != 0) {
    fmt_00.size_ = 1;
    fmt_00.data_ = "\n";
    auVar1._8_8_ = 0;
    auVar1._0_8_ = &ktx2Stream;
    ::fmt::v10::vprint(fmt_00,(format_args)(auVar1 << 0x40));
    ktx2Stream._vptr_StreambufStream = (_func_int **)validationMessages._M_dataplus._M_p;
    ktx2Stream._streambuf =
         (basic_streambuf<char,_std::char_traits<char>_> *)validationMessages._M_string_length;
    fmt_01.size_ = 2;
    fmt_01.data_ = "{}";
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&ktx2Stream;
    args_00.desc_ = 0xd;
    ::fmt::v10::vprint(fmt_01,args_00);
  }
  fmt_02.size_ = 1;
  fmt_02.data_ = "\n";
  auVar2._8_8_ = 0;
  auVar2._0_8_ = &ktx2Stream;
  ::fmt::v10::vprint(fmt_02,(format_args)(auVar2 << 0x40));
  std::ios::clear((int)*(undefined8 *)(*(long *)file + -0x18) + (int)file);
  std::istream::seekg(file,0,0);
  if (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 5) == 0) {
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::StreambufStream
              (&ktx2Stream,
               *(basic_streambuf<char,_std::char_traits<char>_> **)
                (file + *(long *)(*(long *)file + -0x18) + 0xe8),_S_in|_S_bin);
    kVar4 = ktxPrintKTX2InfoTextForStream
                      (ktx2Stream._stream._M_t.
                       super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                       super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                       super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl);
    kVar6 = KTX_SUCCESS;
    if (iVar3 == 0) {
      kVar6 = kVar4;
    }
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
              (&ktx2Stream);
  }
  else {
    kVar6 = KTX_FILE_SEEK_ERROR;
    if (iVar3 != 0) {
      kVar6 = KTX_SUCCESS;
    }
  }
  std::__cxx11::string::~string((string *)&validationMessages);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&messagesOS);
  return kVar6;
}

Assistant:

KTX_error_code CommandInfo::printInfoText(std::istream& file) {
    std::ostringstream messagesOS;
    const auto validationResult = validateIOStream(file, fmtInFile(options.inputFilepath), false, false, [&](const ValidationReport& issue) {
        fmt::print(messagesOS, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
        fmt::print(messagesOS, "    {}\n", issue.details);
    });

    fmt::print("Validation {}\n", validationResult == 0 ? "successful" : "failed");
    const auto validationMessages = std::move(messagesOS).str();
    if (!validationMessages.empty()) {
        fmt::print("\n");
        fmt::print("{}", validationMessages);
    }
    fmt::print("\n");

    file.clear(); // Clear any unexpected EOF from validation
    file.seekg(0);
    if (!file)
        return validationResult == 0 ? KTX_FILE_SEEK_ERROR : KTX_SUCCESS;

    StreambufStream<std::streambuf*> ktx2Stream{file.rdbuf(), std::ios::in | std::ios::binary};
    const auto result = ktxPrintKTX2InfoTextForStream(ktx2Stream.stream());

    return validationResult == 0 ? result : KTX_SUCCESS;
}